

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyser.cpp
# Opt level: O3

void __thiscall SemanticAnalyser::visit(SemanticAnalyser *this,FunctionCallNode *node)

{
  pointer pcVar1;
  unsigned_long __val;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  optional<TypeName> *poVar4;
  long *plVar5;
  mapped_type *pmVar6;
  size_type *psVar7;
  _func_int **pp_Var8;
  _Self __tmp;
  _List_node_base *p_Var9;
  optional<std::reference_wrapper<Symbol>_> oVar10;
  string name;
  list<TypeName,_std::allocator<TypeName>_> expectedArgs;
  TypeChecker typeChecker;
  FunctionAnalyser analyser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  list<TypeName,_std::allocator<TypeName>_> local_108;
  undefined1 local_f0 [12];
  bool local_e4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  undefined1 local_d0 [24];
  list<TypeName,_std::allocator<TypeName>_> lStack_b8;
  FunctionCallNode *local_a0;
  SemanticAnalyser *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  undefined4 extraout_var_00;
  
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  pcVar1 = (node->name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,pcVar1,pcVar1 + (node->name_)._M_string_length);
  local_98 = this;
  oVar10 = SymbolTable::lookup(&this->symbols_,&local_128,0);
  if (((undefined1  [16])
       oVar10.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
       super__Optional_payload_base<std::reference_wrapper<Symbol>_> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    std::operator+(&local_1a8,"Calling undefined function named ",&local_128);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_1a8);
    local_d0._0_8_ = *plVar5;
    pp_Var8 = (_func_int **)(plVar5 + 2);
    if ((_func_int **)local_d0._0_8_ == pp_Var8) {
      local_d0._16_8_ = *pp_Var8;
      lStack_b8.super__List_base<TypeName,_std::allocator<TypeName>_>._M_impl._M_node.
      super__List_node_base._M_next = (_List_node_base *)plVar5[3];
      local_d0._0_8_ = local_d0 + 0x10;
    }
    else {
      local_d0._16_8_ = *pp_Var8;
    }
    local_d0._8_8_ = plVar5[1];
    *plVar5 = (long)pp_Var8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    reportError((string *)local_d0,(Node *)node);
  }
  FunctionAnalyser::FunctionAnalyser((FunctionAnalyser *)local_d0);
  (**(code **)(*(long *)oVar10.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>.
                        _M_payload.super__Optional_payload_base<std::reference_wrapper<Symbol>_>.
                        _M_payload + 0x10))
            (oVar10.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
             super__Optional_payload_base<std::reference_wrapper<Symbol>_>._M_payload,local_d0);
  if (local_d0[8] != false) {
    if ((local_d0._16_8_ & 1) != 0) {
      std::__cxx11::list<TypeName,_std::allocator<TypeName>_>::list(&local_108,&lStack_b8);
      iVar2 = (*(node->super_CallNode).super_ExpressionNode.super_Node._vptr_Node[3])(node);
      p_Var9 = local_108.super__List_base<TypeName,_std::allocator<TypeName>_>._M_impl._M_node.
               super__List_node_base._M_next;
      __val = *(unsigned_long *)(CONCAT44(extraout_var,iVar2) + 0x10);
      if (local_108.super__List_base<TypeName,_std::allocator<TypeName>_>._M_impl._M_node._M_size !=
          __val) {
        std::operator+(&local_90,"Function ",&local_128);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
        local_188._M_dataplus._M_p = (pointer)*plVar5;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((size_type *)local_188._M_dataplus._M_p == psVar7) {
          local_188.field_2._M_allocated_capacity = *psVar7;
          local_188.field_2._8_8_ = plVar5[3];
          local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        }
        else {
          local_188.field_2._M_allocated_capacity = *psVar7;
        }
        local_188._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::to_string
                  ((string *)local_f0,
                   local_108.super__List_base<TypeName,_std::allocator<TypeName>_>._M_impl._M_node.
                   _M_size);
        std::operator+(&local_70,&local_188,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0
                      );
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
        local_168._M_dataplus._M_p = (pointer)*plVar5;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((size_type *)local_168._M_dataplus._M_p == psVar7) {
          local_168.field_2._M_allocated_capacity = *psVar7;
          local_168.field_2._8_8_ = plVar5[3];
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        }
        else {
          local_168.field_2._M_allocated_capacity = *psVar7;
        }
        local_168._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::to_string(&local_50,__val);
        std::operator+(&local_148,&local_168,&local_50);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_148);
        local_1a8._M_dataplus._M_p = (pointer)*plVar5;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((size_type *)local_1a8._M_dataplus._M_p == psVar7) {
          local_1a8.field_2._M_allocated_capacity = *psVar7;
          local_1a8.field_2._8_8_ = plVar5[3];
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        }
        else {
          local_1a8.field_2._M_allocated_capacity = *psVar7;
        }
        local_1a8._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        reportError(&local_1a8,(Node *)node);
      }
      local_a0 = node;
      iVar2 = (*(node->super_CallNode).super_ExpressionNode.super_Node._vptr_Node[3])(node);
      plVar3 = (long *)CONCAT44(extraout_var_00,iVar2);
      plVar5 = (long *)*plVar3;
      if (plVar5 != plVar3) {
        do {
          (**(code **)(*(long *)plVar5[2] + 0x10))((long *)plVar5[2],local_98);
          local_f0._0_8_ = &PTR__Visitor_001e9528;
          local_e4 = false;
          local_e0._M_allocated_capacity = (size_type)&this->symbols_;
          (**(code **)(*(long *)plVar5[2] + 0x10))((long *)plVar5[2],(TypeChecker *)local_f0);
          poVar4 = TypeChecker::getType((TypeChecker *)local_f0);
          if (((poVar4->super__Optional_base<TypeName,_true,_true>)._M_payload.
               super__Optional_payload_base<TypeName>._M_engaged == true) &&
             ((poVar4 = TypeChecker::getType((TypeChecker *)local_f0),
              (poVar4->super__Optional_base<TypeName,_true,_true>)._M_payload.
              super__Optional_payload_base<TypeName>._M_engaged != true ||
              ((poVar4->super__Optional_base<TypeName,_true,_true>)._M_payload.
               super__Optional_payload_base<TypeName>._M_payload._M_value !=
               *(TypeName *)&p_Var9[1]._M_next)))) {
            std::operator+(&local_90,"Function ",&local_128);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
            local_188._M_dataplus._M_p = (pointer)*plVar5;
            psVar7 = (size_type *)(plVar5 + 2);
            if ((size_type *)local_188._M_dataplus._M_p == psVar7) {
              local_188.field_2._M_allocated_capacity = *psVar7;
              local_188.field_2._8_8_ = plVar5[3];
              local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            }
            else {
              local_188.field_2._M_allocated_capacity = *psVar7;
            }
            local_188._M_string_length = plVar5[1];
            *plVar5 = (long)psVar7;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            pmVar6 = std::
                     unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::at(&TypeNameStrings_abi_cxx11_,(key_type *)(p_Var9 + 1));
            std::operator+(&local_70,&local_188,pmVar6);
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
            local_168._M_dataplus._M_p = (pointer)*plVar5;
            psVar7 = (size_type *)(plVar5 + 2);
            if ((size_type *)local_168._M_dataplus._M_p == psVar7) {
              local_168.field_2._M_allocated_capacity = *psVar7;
              local_168.field_2._8_8_ = plVar5[3];
              local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
            }
            else {
              local_168.field_2._M_allocated_capacity = *psVar7;
            }
            local_168._M_string_length = plVar5[1];
            *plVar5 = (long)psVar7;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            poVar4 = TypeChecker::getType((TypeChecker *)local_f0);
            if ((poVar4->super__Optional_base<TypeName,_true,_true>)._M_payload.
                super__Optional_payload_base<TypeName>._M_engaged != false) {
              pmVar6 = std::
                       unordered_map<TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<TypeName>,_std::equal_to<TypeName>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::at(&TypeNameStrings_abi_cxx11_,(key_type *)poVar4);
              std::operator+(&local_148,&local_168,pmVar6);
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_148);
              local_1a8._M_dataplus._M_p = (pointer)*plVar5;
              psVar7 = (size_type *)(plVar5 + 2);
              if ((size_type *)local_1a8._M_dataplus._M_p == psVar7) {
                local_1a8.field_2._M_allocated_capacity = *psVar7;
                local_1a8.field_2._8_8_ = plVar5[3];
                local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
              }
              else {
                local_1a8.field_2._M_allocated_capacity = *psVar7;
              }
              local_1a8._M_string_length = plVar5[1];
              *plVar5 = (long)psVar7;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              reportError(&local_1a8,(Node *)local_a0);
            }
            std::__throw_bad_optional_access();
          }
          p_Var9 = p_Var9->_M_next;
          plVar5 = (long *)*plVar5;
        } while (plVar5 != plVar3);
      }
      while (local_108.super__List_base<TypeName,_std::allocator<TypeName>_>._M_impl._M_node.
             super__List_node_base._M_next != (_List_node_base *)&local_108) {
        p_Var9 = (((_List_base<TypeName,_std::allocator<TypeName>_> *)
                  &(local_108.super__List_base<TypeName,_std::allocator<TypeName>_>._M_impl._M_node.
                    super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.super__List_node_base
                 ._M_next;
        operator_delete(local_108.super__List_base<TypeName,_std::allocator<TypeName>_>._M_impl.
                        _M_node.super__List_node_base._M_next,0x18);
        local_108.super__List_base<TypeName,_std::allocator<TypeName>_>._M_impl._M_node.
        super__List_node_base._M_next = p_Var9;
      }
    }
    local_d0._0_8_ = &PTR__FunctionAnalyser_001e94b8;
    while (lStack_b8.super__List_base<TypeName,_std::allocator<TypeName>_>._M_impl._M_node.
           super__List_node_base._M_next != (_List_node_base *)&lStack_b8) {
      p_Var9 = (((_List_base<TypeName,_std::allocator<TypeName>_> *)
                &(lStack_b8.super__List_base<TypeName,_std::allocator<TypeName>_>._M_impl._M_node.
                  super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.super__List_node_base.
               _M_next;
      operator_delete(lStack_b8.super__List_base<TypeName,_std::allocator<TypeName>_>._M_impl.
                      _M_node.super__List_node_base._M_next,0x18);
      lStack_b8.super__List_base<TypeName,_std::allocator<TypeName>_>._M_impl._M_node.
      super__List_node_base._M_next = p_Var9;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  std::operator+(&local_148,"Symbol ",&local_128);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_148);
  local_1a8._M_dataplus._M_p = (pointer)*plVar5;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_1a8._M_dataplus._M_p == psVar7) {
    local_1a8.field_2._M_allocated_capacity = *psVar7;
    local_1a8.field_2._8_8_ = plVar5[3];
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  }
  else {
    local_1a8.field_2._M_allocated_capacity = *psVar7;
  }
  local_1a8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  reportError(&local_1a8,(Node *)node);
}

Assistant:

void SemanticAnalyser::visit(const FunctionCallNode& node) 
{
  const auto name = node.getName();
  const auto symbol = symbols_.lookup(name);
  if(!symbol)
    reportError("Calling undefined function named " + name + "!", node);

  FunctionAnalyser analyser{};
  symbol.value().get().accept(analyser);
  if(!analyser.isSymbolValid())
    reportError("Symbol " + name + " does not name a function!", node);

  /*
   * If user calls variable of type function, then analyser knows nothing about it's return type and arguments.
   * This is because variables' values are not being tracked.
   */
  if(analyser.getReturnType().has_value())
  {
    const auto expectedArgs = analyser.getArguments();
    const auto& providedArgs = node.getArguments();
    const auto nExpectedArgs = expectedArgs.size();
    const auto nProvidedArgs = providedArgs.size();

    if(nExpectedArgs != nProvidedArgs)
      reportError("Function " + name + " expected " +
        std::to_string(nExpectedArgs) + ", but got " + std::to_string(nProvidedArgs) + " arguments!", node);

    auto expectedArgsIt = expectedArgs.begin();
    for(const auto& arg : node.getArguments())
    {
      arg->accept(*this);

      TypeChecker typeChecker{symbols_};
      arg->accept(typeChecker);
      if(typeChecker.getType().has_value() && typeChecker.getType() != *expectedArgsIt)
        reportError("Function " + name + " expected argument of type " + 
          TypeNameStrings.at(*expectedArgsIt) + ", but got " + 
            TypeNameStrings.at(typeChecker.getType().value()) + "!", node);
      
      expectedArgsIt++;
    }
  }
}